

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O2

void ed_scale_base(ed *out,limb_t *x)

{
  int i;
  long lVar1;
  int iVar2;
  byte *dst;
  bool bVar3;
  sc_t tmp;
  uint8_t pack [32];
  ed R1;
  ed R0;
  pced P;
  
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    tmp[lVar1] = con_off[lVar1] + x[lVar1];
  }
  dst = pack;
  sc_export(dst,tmp);
  memcpy(&R0,&ed_zero,0xa0);
  memcpy(&R1,&ed_zero,0xa0);
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 2) {
    scale16(&P,(int)lVar1,(*dst & 0xf) - 8);
    ed_add_pc(&R0,&R0,&P);
    scale16(&P,(int)lVar1,(*dst >> 4) - 8);
    ed_add_pc(&R1,&R1,&P);
    dst = dst + 1;
  }
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    ed_add(&R1,&R1,&R1);
  }
  ed_add(out,&R0,&R1);
  return;
}

Assistant:

void
ed_scale_base(struct ed *out, const sc_t x)
{
	struct ed R0, R1;
	struct pced P;
	sc_t tmp;
	uint8_t pack[32];
	int i;

	/* s <- x + 8 * (16^64 - 1) / 15 */
	sc_add(tmp, x, con_off);
	sc_export(pack, tmp);

	/*
	 * R0 <- r0*B + r2*16^2*B + ... + r62*16^62*B 
	 * R1 <- r1*B + r3*16^2*B + ... + r63*16^62*B
	 */
	memcpy(&R0, &ed_zero, sizeof(struct ed));
	memcpy(&R1, &ed_zero, sizeof(struct ed));
	for (i = 0; i < 32; i++) {
		scale16(&P, 2*i, (pack[i] & 0xf) - 8);
		ed_add_pc(&R0, &R0, &P);

		scale16(&P, 2*i, (pack[i] >> 4) - 8);
		ed_add_pc(&R1, &R1, &P);
	}

	/* R1 <- 16 * R1 */
	for (i = 0; i < 4; i++)
		ed_add(&R1, &R1, &R1);

	/* out <- R0 + R1 */
	ed_add(out, &R0, &R1);
}